

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::SerializedResourceSignatureImpl::IsCompatible
          (SerializedResourceSignatureImpl *this,SerializedResourceSignatureImpl *Rhs,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags)

{
  DeviceType DVar1;
  int iVar2;
  IPipelineResourceSignature *pIVar3;
  IPipelineResourceSignature *pIVar4;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceFlag;
  ARCHIVE_DEVICE_DATA_FLAGS AVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = DeviceFlags == ARCHIVE_DEVICE_DATA_FLAG_NONE;
  if (!bVar6) {
    DeviceFlag = -DeviceFlags & DeviceFlags;
    DVar1 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
    pIVar3 = GetDeviceSignature(this,DVar1);
    pIVar4 = GetDeviceSignature(Rhs,DVar1);
    bVar7 = pIVar4 != (IPipelineResourceSignature *)0x0;
    if ((pIVar3 == (IPipelineResourceSignature *)0x0) != bVar7) {
      AVar5 = DeviceFlag ^ DeviceFlags;
      do {
        if (((pIVar3 != (IPipelineResourceSignature *)0x0) && (bVar7)) &&
           (iVar2 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[0xf])(pIVar3,pIVar4)
           , (char)iVar2 == '\0')) {
          return bVar6;
        }
        bVar6 = DeviceFlag == DeviceFlags;
        if (bVar6) {
          return bVar6;
        }
        DeviceFlag = -AVar5 & AVar5;
        DVar1 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
        pIVar3 = GetDeviceSignature(this,DVar1);
        pIVar4 = GetDeviceSignature(Rhs,DVar1);
        bVar7 = pIVar4 != (IPipelineResourceSignature *)0x0;
        DeviceFlags = AVar5;
        AVar5 = DeviceFlag ^ AVar5;
      } while ((pIVar3 == (IPipelineResourceSignature *)0x0) != bVar7);
    }
  }
  return bVar6;
}

Assistant:

bool SerializedResourceSignatureImpl::IsCompatible(const SerializedResourceSignatureImpl& Rhs, ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags) const
{
    while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
    {
        const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
        const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

        const auto* pPRS0 = GetDeviceSignature(ArchiveDeviceType);
        const auto* pPRS1 = Rhs.GetDeviceSignature(ArchiveDeviceType);
        if ((pPRS0 == nullptr) != (pPRS1 == nullptr))
            return false;

        if ((pPRS0 != nullptr) && (pPRS1 != nullptr) && !pPRS0->IsCompatibleWith(pPRS1))
            return false;
    }
    return true;
}